

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O1

Edits * __thiscall
icu_63::Edits::mergeAndAppend(Edits *this,Edits *ab,Edits *bc,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  UErrorCode UVar3;
  int iVar4;
  int oldLength;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int newLength;
  bool bVar8;
  Iterator bcIter;
  Iterator abIter;
  UBool local_ad;
  Iterator local_90;
  Iterator local_60;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->errorCode_ < U_ILLEGAL_ARGUMENT_ERROR) {
      local_60.array = ab->array;
      local_60.length = ab->length;
      local_60.index = 0;
      local_60.remaining = 0;
      local_60.onlyChanges_ = '\0';
      local_60.coarse = '\0';
      local_60.dir = '\0';
      local_60.changed = '\0';
      local_60.oldLength_ = 0;
      local_60.newLength_ = 0;
      local_60.srcIndex = 0;
      local_60.replIndex = 0;
      local_60.destIndex = 0;
      local_90.array = bc->array;
      local_90.length = bc->length;
      iVar7 = 0;
      local_90.index = 0;
      local_90.remaining = 0;
      local_90.onlyChanges_ = '\0';
      local_90.coarse = '\0';
      local_90.dir = '\0';
      local_90.changed = '\0';
      local_90.oldLength_ = 0;
      local_90.newLength_ = 0;
      local_90.srcIndex = 0;
      local_90.replIndex = 0;
      local_90.destIndex = 0;
      local_ad = '\x01';
      UVar1 = '\x01';
      iVar5 = 0;
      iVar2 = 0;
      iVar6 = 0;
LAB_0031a7f2:
      do {
        oldLength = 0;
        newLength = 0;
LAB_0031a7f7:
        do {
          if ((iVar5 == 0) && (UVar1 != '\0')) {
            bVar8 = local_60.changed == '\0';
            UVar1 = Iterator::next(&local_90,local_90.onlyChanges_,errorCode);
            iVar5 = 0;
            if (UVar1 != '\0') {
              do {
                iVar6 = local_90.newLength_;
                iVar5 = local_90.oldLength_;
                if (local_90.oldLength_ != 0) goto LAB_0031a8a0;
                newLength = newLength + local_90.newLength_;
                if (iVar2 == 0 || bVar8) {
                  addReplace(this,oldLength,newLength);
                  oldLength = 0;
                  newLength = 0;
                }
                UVar1 = Iterator::next(&local_90,local_90.onlyChanges_,errorCode);
              } while (UVar1 != '\0');
              iVar5 = 0;
            }
          }
LAB_0031a8a0:
          iVar4 = iVar2;
          if (iVar2 != 0) {
LAB_0031a8e3:
            if (iVar5 == 0) {
              UVar3 = *errorCode;
joined_r0x0031aa67:
              if (U_ZERO_ERROR < UVar3) {
                return this;
              }
              UVar3 = U_ILLEGAL_ARGUMENT_ERROR;
              if (U_ILLEGAL_ARGUMENT_ERROR < this->errorCode_) {
                UVar3 = this->errorCode_;
              }
LAB_0031aab1:
              *errorCode = UVar3;
              return this;
            }
            if (local_90.changed == '\0' && local_60.changed == '\0') {
              if (oldLength != 0 || newLength != 0) {
                addReplace(this,oldLength,newLength);
              }
              iVar5 = iVar6;
              if (iVar7 < iVar6) {
                iVar5 = iVar7;
              }
              addUnchanged(this,iVar5);
              iVar7 = iVar7 - iVar5;
              iVar5 = iVar6 - iVar5;
              iVar2 = iVar7;
              iVar6 = iVar5;
              goto LAB_0031a7f2;
            }
            if ((local_60.changed == '\0') && (local_90.changed != '\0')) {
              iVar2 = iVar4 - iVar5;
              if (iVar5 <= iVar4) {
                addReplace(this,iVar5 + oldLength,newLength + iVar6);
                iVar7 = iVar2;
LAB_0031aa17:
                iVar5 = 0;
                goto LAB_0031a7f2;
              }
            }
            else if ((local_60.changed == '\0') || (local_90.changed != '\0')) {
              if (iVar4 == iVar5) {
                addReplace(this,oldLength + iVar7,newLength + iVar6);
                iVar2 = 0;
                goto LAB_0031aa17;
              }
            }
            else if (iVar4 <= iVar5) {
              addReplace(this,oldLength + iVar7,newLength + iVar4);
              iVar5 = iVar5 - iVar4;
              iVar2 = 0;
              iVar6 = iVar5;
              goto LAB_0031a7f2;
            }
            oldLength = oldLength + iVar7;
            newLength = newLength + iVar6;
            iVar2 = iVar4 - iVar5;
            if (iVar4 < iVar5) {
              iVar5 = iVar5 - iVar4;
              iVar2 = 0;
              iVar6 = 0;
            }
            else {
              iVar5 = 0;
              iVar7 = 0;
            }
            goto LAB_0031a7f7;
          }
          if (local_ad == '\0') {
LAB_0031aa5b:
            if (iVar5 == 0) {
              if (oldLength != 0 || newLength != 0) {
                addReplace(this,oldLength,newLength);
              }
              UVar3 = this->errorCode_;
              if (this->errorCode_ < U_ILLEGAL_ARGUMENT_ERROR || U_ZERO_ERROR < *errorCode) {
                return this;
              }
              goto LAB_0031aab1;
            }
            UVar3 = *errorCode;
            goto joined_r0x0031aa67;
          }
          local_ad = Iterator::next(&local_60,local_60.onlyChanges_,errorCode);
          iVar7 = local_60.oldLength_;
          if (local_ad == '\0') goto LAB_0031aa5b;
          iVar4 = local_60.newLength_;
          if (local_60.newLength_ != 0) goto LAB_0031a8e3;
          oldLength = oldLength + local_60.oldLength_;
          if (iVar5 == local_90.oldLength_) break;
          iVar2 = 0;
        } while (local_90.changed != '\0');
        addReplace(this,oldLength,newLength);
        iVar2 = 0;
      } while( true );
    }
    *errorCode = this->errorCode_;
  }
  return this;
}

Assistant:

Edits &Edits::mergeAndAppend(const Edits &ab, const Edits &bc, UErrorCode &errorCode) {
    if (copyErrorTo(errorCode)) { return *this; }
    // Picture string a --(Edits ab)--> string b --(Edits bc)--> string c.
    // Parallel iteration over both Edits.
    Iterator abIter = ab.getFineIterator();
    Iterator bcIter = bc.getFineIterator();
    UBool abHasNext = TRUE, bcHasNext = TRUE;
    // Copy iterator state into local variables, so that we can modify and subdivide spans.
    // ab old & new length, bc old & new length
    int32_t aLength = 0, ab_bLength = 0, bc_bLength = 0, cLength = 0;
    // When we have different-intermediate-length changes, we accumulate a larger change.
    int32_t pending_aLength = 0, pending_cLength = 0;
    for (;;) {
        // At this point, for each of the two iterators:
        // Either we are done with the locally cached current edit,
        // and its intermediate-string length has been reset,
        // or we will continue to work with a truncated remainder of this edit.
        //
        // If the current edit is done, and the iterator has not yet reached the end,
        // then we fetch the next edit. This is true for at least one of the iterators.
        //
        // Normally it does not matter whether we fetch from ab and then bc or vice versa.
        // However, the result is observably different when
        // ab deletions meet bc insertions at the same intermediate-string index.
        // Some users expect the bc insertions to come first, so we fetch from bc first.
        if (bc_bLength == 0) {
            if (bcHasNext && (bcHasNext = bcIter.next(errorCode)) != 0) {
                bc_bLength = bcIter.oldLength();
                cLength = bcIter.newLength();
                if (bc_bLength == 0) {
                    // insertion
                    if (ab_bLength == 0 || !abIter.hasChange()) {
                        addReplace(pending_aLength, pending_cLength + cLength);
                        pending_aLength = pending_cLength = 0;
                    } else {
                        pending_cLength += cLength;
                    }
                    continue;
                }
            }
            // else see if the other iterator is done, too.
        }
        if (ab_bLength == 0) {
            if (abHasNext && (abHasNext = abIter.next(errorCode)) != 0) {
                aLength = abIter.oldLength();
                ab_bLength = abIter.newLength();
                if (ab_bLength == 0) {
                    // deletion
                    if (bc_bLength == bcIter.oldLength() || !bcIter.hasChange()) {
                        addReplace(pending_aLength + aLength, pending_cLength);
                        pending_aLength = pending_cLength = 0;
                    } else {
                        pending_aLength += aLength;
                    }
                    continue;
                }
            } else if (bc_bLength == 0) {
                // Both iterators are done at the same time:
                // The intermediate-string lengths match.
                break;
            } else {
                // The ab output string is shorter than the bc input string.
                if (!copyErrorTo(errorCode)) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                }
                return *this;
            }
        }
        if (bc_bLength == 0) {
            // The bc input string is shorter than the ab output string.
            if (!copyErrorTo(errorCode)) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            }
            return *this;
        }
        //  Done fetching: ab_bLength > 0 && bc_bLength > 0

        // The current state has two parts:
        // - Past: We accumulate a longer ac edit in the "pending" variables.
        // - Current: We have copies of the current ab/bc edits in local variables.
        //   At least one side is newly fetched.
        //   One side might be a truncated remainder of an edit we fetched earlier.

        if (!abIter.hasChange() && !bcIter.hasChange()) {
            // An unchanged span all the way from string a to string c.
            if (pending_aLength != 0 || pending_cLength != 0) {
                addReplace(pending_aLength, pending_cLength);
                pending_aLength = pending_cLength = 0;
            }
            int32_t unchangedLength = aLength <= cLength ? aLength : cLength;
            addUnchanged(unchangedLength);
            ab_bLength = aLength -= unchangedLength;
            bc_bLength = cLength -= unchangedLength;
            // At least one of the unchanged spans is now empty.
            continue;
        }
        if (!abIter.hasChange() && bcIter.hasChange()) {
            // Unchanged a->b but changed b->c.
            if (ab_bLength >= bc_bLength) {
                // Split the longer unchanged span into change + remainder.
                addReplace(pending_aLength + bc_bLength, pending_cLength + cLength);
                pending_aLength = pending_cLength = 0;
                aLength = ab_bLength -= bc_bLength;
                bc_bLength = 0;
                continue;
            }
            // Handle the shorter unchanged span below like a change.
        } else if (abIter.hasChange() && !bcIter.hasChange()) {
            // Changed a->b and then unchanged b->c.
            if (ab_bLength <= bc_bLength) {
                // Split the longer unchanged span into change + remainder.
                addReplace(pending_aLength + aLength, pending_cLength + ab_bLength);
                pending_aLength = pending_cLength = 0;
                cLength = bc_bLength -= ab_bLength;
                ab_bLength = 0;
                continue;
            }
            // Handle the shorter unchanged span below like a change.
        } else {  // both abIter.hasChange() && bcIter.hasChange()
            if (ab_bLength == bc_bLength) {
                // Changes on both sides up to the same position. Emit & reset.
                addReplace(pending_aLength + aLength, pending_cLength + cLength);
                pending_aLength = pending_cLength = 0;
                ab_bLength = bc_bLength = 0;
                continue;
            }
        }
        // Accumulate the a->c change, reset the shorter side,
        // keep a remainder of the longer one.
        pending_aLength += aLength;
        pending_cLength += cLength;
        if (ab_bLength < bc_bLength) {
            bc_bLength -= ab_bLength;
            cLength = ab_bLength = 0;
        } else {  // ab_bLength > bc_bLength
            ab_bLength -= bc_bLength;
            aLength = bc_bLength = 0;
        }
    }
    if (pending_aLength != 0 || pending_cLength != 0) {
        addReplace(pending_aLength, pending_cLength);
    }
    copyErrorTo(errorCode);
    return *this;
}